

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void test_large_deflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  int iVar3;
  int extraout_EAX_04;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr_00;
  long lVar6;
  char **ppcVar7;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  char *__s1;
  undefined4 uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  Byte **ppBVar16;
  uLong auStack_398 [2];
  undefined1 *puStack_388;
  char *pcStack_380;
  ulong uStack_370;
  undefined4 uStack_368;
  undefined4 uStack_350;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  uLong uStack_310;
  char *pcStack_300;
  undefined1 *puStack_2f8;
  code *pcStack_2f0;
  char *pcStack_2e8;
  int iStack_2e0;
  undefined1 *puStack_2d0;
  undefined4 uStack_2c8;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  uLong uStack_288;
  ulong uStack_270;
  code *pcStack_268;
  ulong uStack_258;
  uint uStack_250;
  undefined4 uStack_238;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  char *pcStack_1e8;
  char *pcStack_1e0;
  ulong uStack_1d8;
  code *pcStack_1d0;
  char *pcStack_1c0;
  uint uStack_1b8;
  ulong uStack_1a8;
  undefined4 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  long lStack_150;
  ulong *puStack_148;
  ulong uStack_140;
  code *pcStack_138;
  ulong uStack_128;
  undefined4 uStack_120;
  undefined4 uStack_108;
  ulong uStack_100;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  uLong uStack_b8;
  Byte *pBStack_b0;
  Byte *pBStack_a8;
  code *pcStack_a0;
  Byte *local_98;
  uint local_90;
  Byte *local_80;
  uint local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  ppBVar16 = &local_98;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uVar9 = 1;
  lVar6 = 0x70;
  pcStack_a0 = (code *)0x103096;
  iVar1 = deflateInit_(&local_98,1,"1.2.8");
  if (iVar1 == 0) {
    uVar9 = 0;
    pcStack_a0 = (code *)0x1030b6;
    local_98 = uncompr;
    local_90 = (uint)uncomprLen;
    local_80 = compr;
    local_78 = (uint)comprLen;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_0010314e;
    if (local_90 != 0) goto LAB_00103155;
    pcStack_a0 = (code *)0x1030d8;
    deflateParams(&local_98,0,0);
    local_90 = (uint)comprLen >> 1;
    comprLen = (uLong)local_90;
    uVar9 = 0;
    pcStack_a0 = (code *)0x1030ed;
    local_98 = compr;
    iVar1 = deflate(&local_98);
    if (iVar1 != 0) goto LAB_0010315a;
    pcStack_a0 = (code *)0x103106;
    deflateParams(&local_98,9,1);
    uVar9 = 0;
    pcStack_a0 = (code *)0x103117;
    local_98 = uncompr;
    local_90 = (uint)uncomprLen;
    iVar1 = deflate(&local_98);
    if (iVar1 != 0) goto LAB_00103161;
    uVar9 = 4;
    pcStack_a0 = (code *)0x103128;
    iVar1 = deflate(&local_98);
    ppBVar16 = &local_98;
    if (iVar1 != 1) goto LAB_00103168;
    pcStack_a0 = (code *)0x103135;
    uVar2 = deflateEnd(&local_98);
    ppBVar16 = &local_98;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x10314e;
    test_large_deflate_cold_1();
LAB_0010314e:
    pcStack_a0 = (code *)0x103155;
    test_large_deflate_cold_2();
LAB_00103155:
    pcStack_a0 = (code *)0x10315a;
    test_large_deflate_cold_3();
LAB_0010315a:
    ppBVar16 = (Byte **)comprLen;
    pcStack_a0 = (code *)0x103161;
    test_large_deflate_cold_4();
LAB_00103161:
    pcStack_a0 = (code *)0x103168;
    test_large_deflate_cold_5();
LAB_00103168:
    pcStack_a0 = (code *)0x10316d;
    test_large_deflate_cold_6();
    uVar2 = extraout_EAX;
  }
  uVar13 = (ulong)uVar2;
  pcStack_a0 = test_large_inflate;
  test_large_deflate_cold_7();
  *extraout_RDX = 0x65676162726167;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_120 = (undefined4)uVar9;
  pcVar10 = "1.2.8";
  pcStack_138 = (code *)0x1031c4;
  uStack_128 = uVar13;
  uStack_b8 = uncomprLen;
  pBStack_b0 = compr;
  pBStack_a8 = uncompr;
  pcStack_a0 = (code *)ppBVar16;
  iVar1 = inflateInit_(&uStack_128,"1.2.8",0x70);
  if (iVar1 == 0) {
    compr = (Byte *)&uStack_128;
    do {
      uStack_108 = (undefined4)lVar6;
      pcVar10 = (char *)0x0;
      pcStack_138 = (code *)0x1031e0;
      iVar1 = inflate(compr);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_138 = (code *)0x103227;
      test_large_inflate_cold_4();
      goto LAB_00103227;
    }
    pcStack_138 = (code *)0x1031f3;
    uVar2 = inflateEnd(&uStack_128);
    if (uVar2 != 0) goto LAB_0010322e;
    uVar9 = uVar9 >> 1;
    uVar13 = uStack_100;
    if (uStack_100 == uVar9 + lVar6 * 2) {
      pcStack_138 = (code *)0x103214;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103227:
    pcStack_138 = (code *)0x10322e;
    test_large_inflate_cold_1();
    uVar2 = extraout_EAX_00;
LAB_0010322e:
    uVar13 = (ulong)uVar2;
    pcStack_138 = (code *)0x103235;
    test_large_inflate_cold_2();
  }
  pcStack_138 = test_flush;
  test_large_inflate_cold_3();
  pcStack_1d0 = (code *)0x10325a;
  lStack_150 = lVar6;
  puStack_148 = (ulong *)compr;
  uStack_140 = uVar9;
  sVar4 = strlen(hello);
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uVar9 = 0xffffffff;
  ppcVar7 = (char **)0x70;
  pcStack_1d0 = (code *)0x103287;
  iVar1 = deflateInit_(&pcStack_1c0,0xffffffff,"1.2.8");
  if (iVar1 == 0) {
    pcStack_1c0 = hello;
    uStack_1b8 = 3;
    uStack_1a0 = *(undefined4 *)pcVar10;
    uVar9 = 3;
    pcStack_1d0 = (code *)0x1032ad;
    uStack_1a8 = uVar13;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_001032fa;
    *(char *)(uVar13 + 3) = *(char *)(uVar13 + 3) + '\x01';
    uStack_1b8 = (int)sVar4 - 2;
    sVar4 = (size_t)uStack_1b8;
    uVar9 = 4;
    pcStack_1d0 = (code *)0x1032cc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103301;
    pcStack_1d0 = (code *)0x1032db;
    uVar2 = deflateEnd(&pcStack_1c0);
    if (uVar2 == 0) {
      *(undefined8 *)pcVar10 = uStack_198;
      return;
    }
  }
  else {
    pcStack_1d0 = (code *)0x1032fa;
    test_flush_cold_1();
LAB_001032fa:
    pcStack_1d0 = (code *)0x103301;
    test_flush_cold_2();
LAB_00103301:
    pcStack_1d0 = (code *)0x103308;
    test_flush_cold_4();
    uVar2 = extraout_EAX_01;
  }
  uVar14 = (ulong)uVar2;
  pcStack_1d0 = test_sync;
  test_flush_cold_3();
  pcStack_1e0 = hello;
  *extraout_RDX_00 = 0x65676162726167;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_250 = 2;
  pcVar11 = "1.2.8";
  pcStack_268 = (code *)0x103362;
  uStack_258 = uVar14;
  pcStack_1e8 = pcVar10;
  uStack_1d8 = uVar13;
  pcStack_1d0 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_258,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_238 = SUB84(ppcVar7,0);
    pcVar11 = (char *)0x0;
    pcStack_268 = (code *)0x10337f;
    inflate(&uStack_258);
    uStack_250 = (int)uVar9 - 2;
    uVar9 = (ulong)uStack_250;
    pcStack_268 = (code *)0x103390;
    iVar1 = inflateSync(&uStack_258);
    if (iVar1 != 0) goto LAB_001033da;
    pcVar11 = (char *)0x4;
    pcStack_268 = (code *)0x1033a3;
    iVar1 = inflate(&uStack_258);
    if (iVar1 != -3) goto LAB_001033e1;
    pcStack_268 = (code *)0x1033b2;
    uVar2 = inflateEnd(&uStack_258);
    if (uVar2 == 0) {
      pcStack_268 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",extraout_RDX_00);
      return;
    }
  }
  else {
    pcStack_268 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_268 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_268 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar2 = extraout_EAX_02;
  }
  puVar15 = (ulong *)(ulong)uVar2;
  pcStack_268 = test_dict_deflate;
  test_sync_cold_4();
  uStack_2a8 = 0;
  uStack_2a0 = 0;
  uStack_298 = 0;
  uVar8 = 9;
  pcVar10 = (char *)0x70;
  pcStack_2f0 = (code *)0x103424;
  uStack_270 = uVar9;
  pcStack_268 = (code *)ppcVar7;
  iVar1 = deflateInit_(&pcStack_2e8,9,"1.2.8");
  if (iVar1 == 0) {
    uVar8 = 0x104004;
    pcStack_2f0 = (code *)0x10343c;
    iVar1 = deflateSetDictionary(&pcStack_2e8,"hello",6);
    if (iVar1 != 0) goto LAB_0010349a;
    dictId = uStack_288;
    uStack_2c8 = SUB84(pcVar11,0);
    pcStack_2e8 = hello;
    pcStack_2f0 = (code *)0x103465;
    puStack_2d0 = (undefined1 *)puVar15;
    sVar4 = strlen(hello);
    iStack_2e0 = (int)sVar4 + 1;
    uVar8 = 4;
    pcStack_2f0 = (code *)0x103478;
    iVar1 = deflate(&pcStack_2e8);
    ppcVar7 = &pcStack_2e8;
    if (iVar1 != 1) goto LAB_001034a1;
    pcStack_2f0 = (code *)0x103485;
    uVar2 = deflateEnd(&pcStack_2e8);
    ppcVar7 = &pcStack_2e8;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_2f0 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_2f0 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_2f0 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_03;
  }
  uVar9 = (ulong)uVar2;
  pcStack_2f0 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_330 = 0;
  uStack_328 = 0;
  uStack_320 = 0;
  pcVar12 = "1.2.8";
  uStack_370 = uVar9;
  uStack_368 = uVar8;
  pcStack_300 = pcVar11;
  puStack_2f8 = (undefined1 *)puVar15;
  pcStack_2f0 = (code *)ppcVar7;
  iVar1 = inflateInit_(&uStack_370,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_350 = SUB84(pcVar10,0);
    pcVar10 = "hello";
    do {
      pcVar12 = (char *)0x0;
      iVar1 = inflate(&uStack_370);
      if (iVar1 == 2) {
        if (uStack_310 != dictId) {
          test_dict_inflate_cold_2();
          puVar15 = &uStack_370;
          goto LAB_0010358d;
        }
        pcVar12 = "hello";
        iVar1 = inflateSetDictionary(&uStack_370,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_0010354e:
    iVar1 = inflateEnd(&uStack_370);
    puVar15 = &uStack_370;
    if (iVar1 == 0) {
      pcVar12 = hello;
      pcVar11 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar11;
      puVar15 = &uStack_370;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_04;
  }
  test_dict_inflate_cold_3();
LAB_0010359b:
  test_dict_inflate_cold_4();
  auStack_398[0] = 40000;
  puStack_388 = (undefined1 *)puVar15;
  pcStack_380 = pcVar10;
  pcVar10 = (char *)zlibVersion();
  if (*pcVar10 == '1') {
    pcVar10 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar10,"1.2.8");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr_00,40000);
      if (iVar1 < 2) {
        pcVar10 = "foo.gz";
      }
      else {
        pcVar10 = *(char **)(pcVar12 + 8);
      }
      test_gzio(pcVar10,uncompr_00,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr_00,40000);
      test_large_deflate(compr_00,40000,uncompr_00,40000);
      test_large_inflate(compr_00,40000,uncompr_00,40000);
      test_flush(compr_00,auStack_398);
      test_sync(compr_00,auStack_398[0],uncompr_00,40000);
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr_00,40000);
      free(compr_00);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_large_deflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    z_stream c_stream; /* compression stream */
    int err;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_BEST_SPEED);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_out = compr;
    c_stream.avail_out = (uInt)comprLen;

    /* At this point, uncompr is still mostly zeroes, so it should compress
     * very well:
     */
    c_stream.next_in = uncompr;
    c_stream.avail_in = (uInt)uncomprLen;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");
    if (c_stream.avail_in != 0) {
        fprintf(stderr, "deflate not greedy\n");
        exit(1);
    }

    /* Feed in already compressed data and switch to no compression: */
    deflateParams(&c_stream, Z_NO_COMPRESSION, Z_DEFAULT_STRATEGY);
    c_stream.next_in = compr;
    c_stream.avail_in = (uInt)comprLen/2;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    /* Switch back to compressing mode: */
    deflateParams(&c_stream, Z_BEST_COMPRESSION, Z_FILTERED);
    c_stream.next_in = uncompr;
    c_stream.avail_in = (uInt)uncomprLen;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        fprintf(stderr, "deflate should report Z_STREAM_END\n");
        exit(1);
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}